

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewind.c
# Opt level: O0

void decode_rle(u8 *src,size_t src_size,u8 *dst,u8 *dst_end)

{
  u8 uVar1;
  u32 uVar2;
  int local_38;
  u8 local_31;
  u32 count;
  u8 next;
  u8 last;
  u8 *src_end;
  u8 *dst_end_local;
  u8 *dst_local;
  size_t src_size_local;
  u8 *src_local;
  
  if (src_size == 0) {
    src_size_local = (size_t)src;
    __assert_fail("src_size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/rewind.c",
                  0xa9,"void decode_rle(const u8 *, size_t, u8 *, u8 *)");
  }
  local_31 = *src;
  *dst = local_31;
  dst_end_local = dst + 1;
  src_size_local = (size_t)(src + 1);
  while (src_size_local < src + src_size) {
    uVar1 = *(u8 *)src_size_local;
    if (uVar1 == local_31) {
      src_size_local = src_size_local + 1;
      uVar2 = read_varint((u8 **)&src_size_local);
      for (local_38 = uVar2 + 1; local_38 != 0; local_38 = local_38 + -1) {
        *dst_end_local = local_31;
        dst_end_local = dst_end_local + 1;
      }
    }
    else {
      *dst_end_local = uVar1;
      local_31 = uVar1;
      dst_end_local = dst_end_local + 1;
      src_size_local = src_size_local + 1;
    }
  }
  if (dst_end_local != dst_end) {
    __assert_fail("dst == dst_end",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/rewind.c",
                  0xab,"void decode_rle(const u8 *, size_t, u8 *, u8 *)");
  }
  return;
}

Assistant:

static void decode_rle(const u8* src, size_t src_size, u8* dst, u8* dst_end) {
#define WRITE(x) *dst++ = (x)
  DECODE_RLE(WRITE, src, src_size);
#undef WRITE
  assert(dst == dst_end);
}